

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

ssize_t __thiscall fmt::File::write(File *this,int __fd,void *__buf,size_t __n)

{
  int __fd_00;
  void *__buf_00;
  size_t __n_00;
  int *piVar1;
  undefined8 uVar2;
  Type TVar3;
  undefined4 in_register_00000034;
  bool bVar4;
  RWResult result;
  SystemError *in_stack_ffffffffffffffc8;
  CStringRef in_stack_ffffffffffffffd0;
  BasicCStringRef<char> local_28;
  long local_20;
  void *local_18;
  void *local_10;
  File *local_8;
  
  local_10 = (void *)CONCAT44(in_register_00000034,__fd);
  local_20 = 0;
  local_18 = __buf;
  local_8 = this;
  do {
    __buf_00 = local_10;
    __fd_00 = this->fd_;
    __n_00 = anon_unknown.dwarf_90f43::convert_rwcount((size_t)local_18);
    local_20 = ::write(__fd_00,__buf_00,__n_00);
    bVar4 = false;
    if (local_20 == -1) {
      piVar1 = __errno_location();
      bVar4 = *piVar1 == 4;
    }
  } while (bVar4);
  if (local_20 < 0) {
    uVar2 = __cxa_allocate_exception(0x18);
    __errno_location();
    BasicCStringRef<char>::BasicCStringRef(&local_28,"cannot write to file");
    SystemError::SystemError
              (in_stack_ffffffffffffffc8,(int)((ulong)this >> 0x20),in_stack_ffffffffffffffd0);
    __cxa_throw(uVar2,&SystemError::typeinfo,SystemError::~SystemError);
  }
  TVar3 = internal::to_unsigned<long>(local_20);
  return TVar3;
}

Assistant:

std::size_t fmt::File::write(const void *buffer, std::size_t count) {
  RWResult result = 0;
  FMT_RETRY(result, FMT_POSIX_CALL(write(fd_, buffer, convert_rwcount(count))));
  if (result < 0)
    FMT_THROW(SystemError(errno, "cannot write to file"));
  return internal::to_unsigned(result);
}